

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O2

void __thiscall
OptionParser::setOption(OptionParser *this,string *keyword,string *value,Network *network)

{
  InputError *pIVar1;
  bool bVar2;
  StringOption option;
  int iVar3;
  IndexOption option_00;
  ValueOption option_01;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  double local_30;
  double x;
  
  option = Utilities::findFullMatch(keyword,stringOptionKeywords);
  if ((int)option < 0) {
    option_00 = Utilities::findFullMatch(keyword,indexOptionKeywords);
    if ((int)option_00 < 0) {
      option_01 = Utilities::findFullMatch(keyword,valueOptionKeywords);
      if ((int)option_01 < 0) {
        pIVar1 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_70,(string *)keyword);
        InputError::InputError(pIVar1,3,&local_70);
        __cxa_throw(pIVar1,&InputError::typeinfo,ENerror::~ENerror);
      }
      bVar2 = Utilities::parseNumber<double>(value,&local_30);
      if (!bVar2) {
        pIVar1 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_50,(string *)value);
        InputError::InputError(pIVar1,6,&local_50);
        __cxa_throw(pIVar1,&InputError::typeinfo,ENerror::~ENerror);
      }
      Options::setOption(&network->options,option_01,local_30);
    }
    else {
      iVar3 = Options::setOption(&network->options,option_00,value,network);
      if (iVar3 != 0) {
        pIVar1 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_90,(string *)value);
        InputError::InputError(pIVar1,iVar3,&local_90);
        __cxa_throw(pIVar1,&InputError::typeinfo,ENerror::~ENerror);
      }
    }
  }
  else {
    iVar3 = Options::setOption(&network->options,option,value);
    if (iVar3 != 0) {
      pIVar1 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_b0,(string *)value);
      InputError::InputError(pIVar1,iVar3,&local_b0);
      __cxa_throw(pIVar1,&InputError::typeinfo,ENerror::~ENerror);
    }
  }
  return;
}

Assistant:

void OptionParser::setOption(const string& keyword, const string& value,
                             Network* network)
{
    // ... try to assign value to a string option

    int option = Utilities::findFullMatch(keyword, stringOptionKeywords);
    if ( option >=  0 )
    {
        int err = network->options.setOption(
                      (Options::StringOption)option, value);
        if ( err ) throw InputError(err, value);
        return;
    }

    // ... try to assign value to a category option

    option = Utilities::findFullMatch(keyword, indexOptionKeywords);
    if ( option >= 0 )
    {
        int err = network->options.setOption(
                      (Options::IndexOption)option, value, network);
        if ( err ) throw InputError(err, value);
        return;
    }

    // ... try to assign value to a value option

    option = Utilities::findFullMatch(keyword, valueOptionKeywords);
    if ( option < 0 ) throw InputError(InputError::INVALID_KEYWORD, keyword);
    double x;
    if (!Utilities::parseNumber(value, x))
    {
        throw InputError(InputError::INVALID_NUMBER, value);
    }
    network->options.setOption((Options::ValueOption)option, x);
}